

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QWindowSystemInterface::TouchPoint>::relocate
          (QArrayDataPointer<QWindowSystemInterface::TouchPoint> *this,qsizetype offset,
          TouchPoint **data)

{
  bool bVar1;
  long n;
  TouchPoint *in_RDX;
  long in_RSI;
  TouchPoint *in_RDI;
  TouchPoint **unaff_retaddr;
  TouchPoint *res;
  TouchPoint *c;
  
  n = in_RDI->uniqueId + in_RSI * 0x78;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<QWindowSystemInterface::TouchPoint,long_long>(in_RDX,n,in_RDI);
  if ((in_RDX != (TouchPoint *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QWindowSystemInterface::TouchPoint>,QWindowSystemInterface::TouchPoint_const*>
                        (unaff_retaddr,(QArrayDataPointer<QWindowSystemInterface::TouchPoint> *)c),
     bVar1)) {
    *(long *)in_RDX = in_RSI * 0x78 + *(long *)in_RDX;
  }
  in_RDI->uniqueId = n;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }